

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

partSizeData *
initScanLine(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             *pixelData,FrameBuffer *buf,InputPart *in,Header *outHeader)

{
  int iVar1;
  PixelType PVar2;
  char *pcVar3;
  bool bVar4;
  Channel *pCVar5;
  Slice *pSVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  string *psVar10;
  Compression *pCVar11;
  char *in_RDX;
  long lVar12;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *in_RSI;
  partSizeData *in_RDI;
  size_t pixelsInChannel;
  int samplesize;
  ConstIterator i;
  size_t rawSize;
  int channelNumber;
  uint64_t offsetToOrigin;
  int numChans;
  uint64_t numPixels;
  uint64_t height;
  uint64_t width;
  Box2i dw;
  partSizeData *data;
  int in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Header *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffea8;
  partSizeData *in_stack_fffffffffffffeb0;
  Slice local_c8 [56];
  long local_90;
  int local_84;
  undefined8 local_80;
  undefined8 local_78;
  uint64_t local_70;
  int local_64;
  long local_60;
  int local_54;
  long local_50;
  ulong local_48;
  ulong local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  char *local_18;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Imf_3_4::InputPart::header();
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_40 = (ulong)((local_30 + 1) - local_38);
  local_48 = (ulong)((local_2c + 1) - local_34);
  local_50 = local_40 * local_48;
  Imf_3_4::InputPart::header();
  local_54 = channelCount(in_stack_fffffffffffffea0);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::resize((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_60 = local_40 * (long)local_34 + (long)local_38;
  local_64 = 0;
  local_70 = 0;
  Imf_3_4::Header::channels();
  local_78 = Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    local_80 = Imf_3_4::ChannelList::end();
    bVar4 = Imf_3_4::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    if (!bVar4) break;
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x11368a);
    local_84 = Imf_3_4::pixelTypeSize(*(PixelType *)pCVar5);
    uVar9 = local_40;
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1136b2);
    uVar8 = local_48;
    iVar1 = *(int *)(pCVar5 + 4);
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1136e2);
    local_90 = (uVar9 / (ulong)(long)iVar1) * (uVar8 / (ulong)(long)*(int *)(pCVar5 + 8));
    local_70 = local_90 * local_84 + local_70;
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_64);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8);
    pcVar3 = local_18;
    pSVar6 = (Slice *)Imf_3_4::ChannelList::ConstIterator::name((ConstIterator *)0x113776);
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x11378b);
    PVar2 = *(PixelType *)pCVar5;
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[](local_10,(long)local_64);
    pcVar7 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1137ae);
    lVar12 = local_60 * local_84;
    uVar8 = (ulong)local_84;
    uVar9 = (long)local_84 * local_40;
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x1137ff);
    iVar1 = *(int *)(pCVar5 + 4);
    pCVar5 = Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x113813);
    in_stack_fffffffffffffe88 = *(int *)(pCVar5 + 8);
    in_stack_fffffffffffffe90 = 0;
    Imf_3_4::Slice::Slice
              (local_c8,PVar2,pcVar7 + -lVar12,uVar8,uVar9,iVar1,in_stack_fffffffffffffe88,0.0,false
               ,false);
    Imf_3_4::FrameBuffer::insert(pcVar3,pSVar6);
    local_64 = local_64 + 1;
    Imf_3_4::ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  partSizeData::partSizeData(in_stack_fffffffffffffeb0);
  in_RDI->rawSize = local_70;
  in_RDI->pixelCount = local_40 * local_48;
  Imf_3_4::InputPart::header();
  psVar10 = (string *)Imf_3_4::Header::type_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&in_RDI->partType,psVar10);
  Imf_3_4::InputPart::header();
  pCVar11 = (Compression *)Imf_3_4::Header::compression();
  in_RDI->compression = *pCVar11;
  in_RDI->channelCount = (long)local_54;
  return in_RDI;
}

Assistant:

partSizeData
initScanLine (
    vector<vector<char>>& pixelData,
    FrameBuffer&          buf,
    InputPart&            in,
    const Header&         outHeader)
{
    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());

    pixelData.resize (numChans);
    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    int    channelNumber = 0;
    size_t rawSize       = 0;

    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        int    samplesize      = pixelTypeSize (i.channel ().type);
        size_t pixelsInChannel = (width / i.channel ().xSampling) *
                                 (height / i.channel ().ySampling);
        rawSize += pixelsInChannel * samplesize;
        pixelData[channelNumber].resize (numPixels * samplesize);

        buf.insert (
            i.name (),
            Slice (
                i.channel ().type,
                pixelData[channelNumber].data () - offsetToOrigin * samplesize,
                samplesize,
                samplesize * width,
                i.channel ().xSampling,
                i.channel ().ySampling));
        ++channelNumber;
    }

    partSizeData data;
    data.rawSize      = rawSize;
    data.pixelCount   = width * height;
    data.partType     = in.header ().type ();
    data.compression  = in.header ().compression ();
    data.channelCount = numChans;
    return data;
}